

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

VisitReturn __thiscall
QMakeEvaluator::evaluateExpandFunction
          (QMakeEvaluator *this,ProKey *func,ushort **tokPtr,ProStringList *ret)

{
  bool bVar1;
  QList<ProStringList> *lists;
  char *pcVar2;
  ProStringList *in_RCX;
  QList<ProStringList> *in_RDX;
  QMakeEvaluator *in_RSI;
  QMakeEvaluator *in_RDI;
  long in_FS_OFFSET;
  QStringView QVar3;
  QByteArrayView QVar4;
  QList<ProStringList> args_1;
  ConstIterator it;
  ProStringList args;
  const_iterator adef;
  ProStringList *in_stack_00000460;
  ProStringList *in_stack_00000468;
  ProKey *in_stack_00000470;
  QMakeBuiltin *in_stack_00000478;
  QMakeEvaluator *in_stack_00000480;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  QStringView *in_stack_fffffffffffffe20;
  QList<ProStringList> *in_stack_fffffffffffffe28;
  QString *str;
  int fieldWidth;
  QStringView *in_stack_fffffffffffffe30;
  QMakeEvaluator *in_stack_fffffffffffffe38;
  QStringView *this_00;
  QMakeEvaluator *in_stack_fffffffffffffe40;
  QMakeEvaluator *this_01;
  undefined4 in_stack_fffffffffffffe7c;
  QChar fillChar;
  VisitReturn VVar5;
  qsizetype local_170;
  storage_type_conflict *local_168;
  qsizetype local_158;
  storage_type_conflict *local_150;
  QChar local_142;
  qsizetype local_140;
  storage_type_conflict *local_138;
  storage_type *local_130;
  QString local_f0 [2];
  qsizetype local_c0;
  storage_type_conflict *local_b8;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  piter local_80;
  piter local_70;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  piter local_48;
  piter local_38;
  undefined1 local_28 [32];
  long local_8;
  
  fillChar.ucs = (char16_t)((uint)in_stack_fffffffffffffe7c >> 0x10);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.bucket = 0xaaaaaaaaaaaaaaaa;
  local_38.d = (Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *)0xaaaaaaaaaaaaaaaa;
  this_01 = in_RDI;
  local_38 = (piter)QHash<ProKey,_QMakeInternal::QMakeBuiltin>::constFind
                              ((QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)
                               in_stack_fffffffffffffe20,
                               (ProKey *)
                               CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  local_48 = (piter)QHash<ProKey,_QMakeInternal::QMakeBuiltin>::constEnd
                              ((QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)
                               in_stack_fffffffffffffe28);
  bVar1 = QHash<ProKey,_QMakeInternal::QMakeBuiltin>::const_iterator::operator!=
                    ((const_iterator *)in_stack_fffffffffffffe28,
                     (const_iterator *)in_stack_fffffffffffffe20);
  if (bVar1) {
    local_60 = 0xaaaaaaaaaaaaaaaa;
    local_58 = 0xaaaaaaaaaaaaaaaa;
    local_50 = 0xaaaaaaaaaaaaaaaa;
    ProStringList::ProStringList((ProStringList *)0x2f1dbb);
    VVar5 = expandVariableReferences
                      (in_RDI,(ushort **)in_stack_fffffffffffffe40,
                       (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                       (ProStringList *)in_stack_fffffffffffffe30,
                       SUB81((ulong)in_stack_fffffffffffffe28 >> 0x38,0));
    if (VVar5 == ReturnError) {
      VVar5 = ReturnError;
    }
    else {
      QHash<ProKey,_QMakeInternal::QMakeBuiltin>::const_iterator::operator*
                ((const_iterator *)0x2f1e01);
      VVar5 = evaluateBuiltinExpand
                        (in_stack_00000480,in_stack_00000478,in_stack_00000470,in_stack_00000468,
                         in_stack_00000460);
    }
    ProStringList::~ProStringList((ProStringList *)0x2f1e39);
  }
  else {
    local_70.bucket = 0xaaaaaaaaaaaaaaaa;
    local_70.d = (Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *)0xaaaaaaaaaaaaaaaa;
    local_70 = (piter)QHash<ProKey,_ProFunctionDef>::constFind
                                ((QHash<ProKey,_ProFunctionDef> *)in_stack_fffffffffffffe20,
                                 (ProKey *)
                                 CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    local_80 = (piter)QHash<ProKey,_ProFunctionDef>::constEnd
                                ((QHash<ProKey,_ProFunctionDef> *)in_stack_fffffffffffffe28);
    bVar1 = QHash<ProKey,_ProFunctionDef>::const_iterator::operator!=
                      ((const_iterator *)in_stack_fffffffffffffe28,
                       (const_iterator *)in_stack_fffffffffffffe20);
    if (bVar1) {
      local_98 = 0xaaaaaaaaaaaaaaaa;
      local_90 = 0xaaaaaaaaaaaaaaaa;
      local_88 = 0xaaaaaaaaaaaaaaaa;
      QList<ProStringList>::QList((QList<ProStringList> *)0x2f1f03);
      VVar5 = prepareFunctionArgs(in_stack_fffffffffffffe38,(ushort **)in_stack_fffffffffffffe30,
                                  in_stack_fffffffffffffe28);
      if (VVar5 == ReturnError) {
        VVar5 = ReturnError;
      }
      else {
        if (in_RDI->m_debugLevel != 0) {
          this_00 = (QStringView *)(local_28 + 0x10);
          QStringView::QStringView<QString,_true>
                    ((QStringView *)in_RSI,(QString *)in_stack_fffffffffffffe28);
          QVar3 = QStringView::mid(this_00,(qsizetype)in_RDI,(qsizetype)in_stack_fffffffffffffe40);
          local_158 = QVar3.m_size;
          local_150 = QVar3.m_data;
          local_c0 = local_158;
          local_b8 = local_150;
          QStringView::toLocal8Bit(in_stack_fffffffffffffe20);
          lists = (QList<ProStringList> *)QByteArray::constData((QByteArray *)0x2f1fe3);
          formatValueListList(lists);
          QtPrivate::asString(local_f0);
          QString::toLocal8Bit((QString *)this_00);
          pcVar2 = QByteArray::constData((QByteArray *)0x2f2027);
          traceMsgInternal(in_RDI,"calling $$%s(%s)",lists,pcVar2);
          QByteArray::~QByteArray((QByteArray *)0x2f204f);
          QString::~QString((QString *)0x2f205c);
          QByteArray::~QByteArray((QByteArray *)0x2f2069);
        }
        QHash<ProKey,_ProFunctionDef>::const_iterator::operator*((const_iterator *)0x2f2076);
        VVar5 = evaluateFunction(this_01,(ProFunctionDef *)in_RSI,in_RDX,in_RCX);
      }
      QList<ProStringList>::~QList((QList<ProStringList> *)0x2f20a9);
    }
    else {
      skipExpression(in_stack_fffffffffffffe40,(ushort **)in_stack_fffffffffffffe38);
      QByteArrayView::QByteArrayView<43ul>
                ((QByteArrayView *)in_stack_fffffffffffffe30,
                 (char (*) [43])in_stack_fffffffffffffe28);
      QVar4.m_data = local_130;
      QVar4.m_size = (qsizetype)&stack0xfffffffffffffee0;
      QString::fromLatin1(QVar4);
      str = (QString *)local_28;
      QStringView::QStringView<QString,_true>(in_stack_fffffffffffffe30,str);
      fieldWidth = (int)((ulong)str >> 0x20);
      QVar3 = QStringView::mid((QStringView *)in_stack_fffffffffffffe38,(qsizetype)in_RDI,
                               (qsizetype)in_stack_fffffffffffffe40);
      local_170 = QVar3.m_size;
      local_168 = QVar3.m_data;
      local_140 = local_170;
      local_138 = local_168;
      QChar::QChar<char16_t,_true>(&local_142,L' ');
      QString::arg<QStringView,_true>
                ((QString *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,fieldWidth,fillChar)
      ;
      evalError(in_RSI,(QString *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      QString::~QString((QString *)0x2f21ae);
      QString::~QString((QString *)0x2f21bb);
      VVar5 = ReturnFalse;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return VVar5;
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::evaluateExpandFunction(
        const ProKey &func, const ushort *&tokPtr, ProStringList *ret)
{
    auto adef = statics.expands.constFind(func);
    if (adef != statics.expands.constEnd()) {
        //why don't the builtin functions just use args_list? --Sam
        ProStringList args;
        if (expandVariableReferences(tokPtr, 5, &args, true) == ReturnError)
            return ReturnError;
        return evaluateBuiltinExpand(*adef, func, args, *ret);
    }

    QHash<ProKey, ProFunctionDef>::ConstIterator it =
            m_functionDefs.replaceFunctions.constFind(func);
    if (it != m_functionDefs.replaceFunctions.constEnd()) {
        QList<ProStringList> args;
        if (prepareFunctionArgs(tokPtr, &args) == ReturnError)
            return ReturnError;
        traceMsg("calling $$%s(%s)", dbgKey(func), dbgStrListList(args));
        return evaluateFunction(*it, args, ret);
    }

    skipExpression(tokPtr);
    evalError(fL1S("'%1' is not a recognized replace function.").arg(func.toQStringView()));
    return ReturnFalse;
}